

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O2

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_group<char_const*>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,
          regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          *this,char **begin,char *end)

{
  compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  *this_00;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sVar5;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iVar6;
  __type _Var7;
  compiler_token_type cVar8;
  tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar9;
  bool pure;
  mark_begin_matcher *matcher;
  mark_end_matcher *matcher_00;
  mark_begin_matcher *matcher_01;
  mark_end_matcher *matcher_02;
  lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *matcher_03;
  lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *matcher_04;
  keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *matcher_05;
  regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher_06;
  bool no;
  size_t i_1;
  ulong uVar10;
  char *tr;
  long lVar11;
  undefined4 uVar12;
  size_t i;
  bool bVar13;
  bool cond;
  shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  impl;
  undefined1 local_138 [8];
  weak_count local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  undefined4 local_f4;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  char *tmp;
  long local_b0;
  string_type name;
  string local_88 [32];
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seq_end;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  detail::
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::sequence(&local_f0);
  detail::
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::sequence(&seq_end);
  tmp = (char *)0x0;
  this_00 = (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
             *)(this + 0x10);
  local_f4 = *(undefined4 *)(this + 0x220);
  cVar8 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          ::get_group_type<char_const*>(this_00,begin,end,&name);
  switch(cVar8) {
  case token_no_mark:
    tmp = *begin;
    cVar8 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            ::get_token<char_const*>(this_00,&tmp,end);
    if (cVar8 == token_group_end) {
      *begin = tmp;
      goto LAB_00122659;
    }
    goto LAB_00122958;
  case token_positive_lookahead:
    bVar13 = true;
    bVar3 = false;
    goto LAB_001226df;
  case token_negative_lookahead:
    bVar13 = true;
    bVar3 = false;
    goto LAB_001226a7;
  case token_positive_lookbehind:
    bVar3 = true;
    bVar13 = false;
LAB_001226df:
    no = false;
LAB_001226e1:
    bVar4 = false;
LAB_00122962:
    parse_alternates<char_const*>
              ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,this,begin,end);
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator+=(&local_f0,
                 (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138);
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator+=(&local_f0,&seq_end);
    if (*begin == end) {
      cond = false;
    }
    else {
      cVar8 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ::get_token<char_const*>(this_00,begin,end);
      cond = cVar8 == token_group_end;
    }
    detail::ensure_(cond,error_paren,"mismatched parenthesis",
                    "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
                    ,0x1b7);
    if (bVar13) {
      detail::
      make_independent_end_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138,(detail *)(ulong)local_f0.pure_,pure);
      detail::
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator+=(&local_f0,
                   (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138);
      detail::
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
      impl.px = (element_type *)local_f0.head_.xpr_.px;
      if (local_f0.head_.xpr_.px !=
          (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        LOCK();
        (((_Rb_tree_header *)((long)local_f0.head_.xpr_.px + 8))->_M_header)._M_color =
             (((_Rb_tree_header *)((long)local_f0.head_.xpr_.px + 8))->_M_header)._M_color +
             _S_black;
        UNLOCK();
      }
      impl.pn.pi_._1_1_ = local_f0.pure_;
      impl.pn.pi_._0_1_ = no;
      detail::
      make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>
                ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138,(detail *)&impl,matcher_03);
LAB_00122b2a:
      detail::
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_f0,
                  (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
      detail::
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138);
      intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~intrusive_ptr((intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&impl);
    }
    else {
      if (bVar3) {
        detail::
        make_independent_end_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138,(detail *)(ulong)local_f0.pure_,pure);
        detail::
        sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator+=(&local_f0,
                     (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
        detail::
        sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_138);
        detail::
        lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::lookbehind_matcher
                  ((lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&impl,&local_f0.head_,local_f0.width_.value_,no,local_f0.pure_);
        detail::
        make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>
                  ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138,(detail *)&impl,matcher_04);
        goto LAB_00122b2a;
      }
      if (bVar4) {
        detail::
        make_independent_end_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138,(detail *)(ulong)local_f0.pure_,pure);
        detail::
        sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator+=(&local_f0,
                     (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_138);
        detail::
        sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_138);
        impl.px = (element_type *)local_f0.head_.xpr_.px;
        if (local_f0.head_.xpr_.px !=
            (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          LOCK();
          (((_Rb_tree_header *)((long)local_f0.head_.xpr_.px + 8))->_M_header)._M_color =
               (((_Rb_tree_header *)((long)local_f0.head_.xpr_.px + 8))->_M_header)._M_color +
               _S_black;
          UNLOCK();
        }
        impl.pn.pi_._0_1_ = local_f0.pure_;
        detail::
        make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>>
                  ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_138,(detail *)&impl,matcher_05);
        goto LAB_00122b2a;
      }
    }
    iVar6.px = local_f0.alt_end_xpr_.px;
    sVar5.xpr_.px = local_f0.head_.xpr_.px;
    *(undefined4 *)(this + 0x220) = local_f4;
    local_f0.head_.xpr_.px =
         (matchable_ptr)
         (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    *(ulong *)__return_storage_ptr__ = CONCAT71(local_f0._1_7_,local_f0.pure_);
    (__return_storage_ptr__->width_).value_ = local_f0.width_.value_;
    __return_storage_ptr__->quant_ = local_f0.quant_;
    (__return_storage_ptr__->head_).xpr_.px =
         (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)sVar5.xpr_.px;
    __return_storage_ptr__->tail_ = local_f0.tail_;
    local_f0.alt_end_xpr_.px =
         (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (__return_storage_ptr__->alt_end_xpr_).px = iVar6.px;
    __return_storage_ptr__->alternates_ = local_f0.alternates_;
    break;
  case token_negative_lookbehind:
    bVar3 = true;
    bVar13 = false;
LAB_001226a7:
    no = true;
    goto LAB_001226e1;
  case token_independent_sub_expression:
    bVar4 = true;
    bVar13 = false;
    bVar3 = false;
    no = false;
    goto LAB_00122962;
  case token_comment:
    do {
      while( true ) {
        bVar13 = detail::ensure_(*begin != end,error_paren,"mismatched parenthesis",
                                 "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
                                 ,
                                 "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
                                 ,0x158);
        if (!bVar13) goto LAB_00122958;
        cVar8 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                ::get_token<char_const*>(this_00,begin,end);
        if (cVar8 != token_literal) break;
LAB_00122787:
        *begin = *begin + 1;
      }
      if (cVar8 == token_escape) {
        detail::ensure_(*begin != end,error_escape,"incomplete escape sequence",
                        "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
                        ,0x15f);
        goto LAB_00122787;
      }
    } while (cVar8 != token_group_end);
LAB_00122659:
    parse_atom<char_const*>(__return_storage_ptr__,this,begin,end);
    break;
  case token_recurse:
    if (*begin == end) {
      bVar13 = false;
    }
    else {
      cVar8 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ::get_token<char_const*>(this_00,begin,end);
      bVar13 = cVar8 == token_group_end;
    }
    detail::ensure_(bVar13,error_paren,"mismatched parenthesis",
                    "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
                    ,0x170);
    local_138 = *(undefined1 (*) [8])(this + 0x230);
    local_130.pi_ = *(sp_counted_base **)(this + 0x238);
    local_128._M_allocated_capacity = (size_type)local_138;
    if (local_130.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_130.pi_)->weak_count_ = (local_130.pi_)->weak_count_ + 1;
      UNLOCK();
      local_128._M_allocated_capacity = *(undefined8 *)(this + 0x230);
    }
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
              (__return_storage_ptr__,(detail *)local_138,
               (regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
    boost::detail::weak_count::~weak_count(&local_130);
    break;
  case token_rule_assign:
    regex_error::regex_error
              ((regex_error *)local_138,error_badrule,
               "rule assignments must be at the front of the regex");
    impl.px = (element_type *)anon_var_dwarf_66751;
    impl.pn.pi_ = (sp_counted_base *)anon_var_dwarf_6856e;
    throw_exception<boost::xpressive::regex_error>
              ((regex_error *)local_138,(source_location *)&impl);
  case token_rule_ref:
    if (*begin == end) {
      bVar13 = false;
    }
    else {
      cVar8 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ::get_token<char_const*>(this_00,begin,end);
      bVar13 = cVar8 == token_group_end;
    }
    detail::ensure_(bVar13,error_paren,"mismatched parenthesis",
                    "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
                    ,0x181);
    this_01 = (tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)(this + 0x240),&name);
    psVar9 = detail::
             tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::get(this_01);
    local_138 = (undefined1  [8])psVar9->px;
    local_130.pi_ = (psVar9->pn).pi_;
    if (local_130.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_130.pi_)->use_count_ = (local_130.pi_)->use_count_ + 1;
      UNLOCK();
    }
    impl.px = (element_type *)local_138;
    impl.pn.pi_ = local_130.pi_;
    detail::
    enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::track_reference(*(enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        **)(this + 0x230),
                      (enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_138);
    if (local_130.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_130.pi_)->weak_count_ = (local_130.pi_)->weak_count_ + 1;
      UNLOCK();
    }
    local_128._M_allocated_capacity = (size_type)local_138;
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
              (__return_storage_ptr__,(detail *)local_138,matcher_06);
    boost::detail::weak_count::~weak_count(&local_130);
    boost::detail::shared_count::~shared_count(&impl.pn);
    break;
  case token_named_mark:
    local_b0 = *(long *)this + 1;
    *(long *)this = local_b0;
    lVar11 = 0;
    uVar10 = 0;
    while( true ) {
      lVar2 = *(long *)(this + 0x230);
      if ((ulong)((*(long *)(lVar2 + 0x98) - *(long *)(lVar2 + 0x90)) / 0x28) <= uVar10) break;
      bVar13 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (*(long *)(lVar2 + 0x90) + lVar11),&name);
      detail::ensure_(bVar13,error_badmark,"named mark already exists",
                      "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
                      ,0x18c);
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x28;
    }
    std::__cxx11::string::string(local_88,(string *)&name);
    psVar1 = *(shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               **)this;
    std::__cxx11::string::string((string *)local_138,local_88);
    local_118 = psVar1;
    std::
    vector<boost::xpressive::detail::named_mark<char>,std::allocator<boost::xpressive::detail::named_mark<char>>>
    ::emplace_back<boost::xpressive::detail::named_mark<char>>
              ((vector<boost::xpressive::detail::named_mark<char>,std::allocator<boost::xpressive::detail::named_mark<char>>>
                *)(lVar2 + 0x90),(named_mark<char> *)local_138);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string(local_88);
    uVar12 = (undefined4)local_b0;
    impl.px = (element_type *)CONCAT44(impl.px._4_4_,uVar12);
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::mark_begin_matcher>
              ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,(detail *)&impl,matcher_01);
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_f0,
                (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
    impl.px = (element_type *)CONCAT44(impl.px._4_4_,uVar12);
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::mark_end_matcher>
              ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,(detail *)&impl,matcher_02);
    goto LAB_0012293b;
  case token_named_mark_ref:
    if (*begin == end) {
      bVar13 = false;
    }
    else {
      cVar8 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              ::get_token<char_const*>(this_00,begin,end);
      bVar13 = cVar8 == token_group_end;
    }
    tr = 
    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
    ;
    detail::ensure_(bVar13,error_paren,"mismatched parenthesis",
                    "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
                    ,0x199);
    lVar11 = 0;
    uVar10 = 0;
    while( true ) {
      lVar2 = *(long *)(*(long *)(this + 0x230) + 0x90);
      if ((ulong)((*(long *)(*(long *)(this + 0x230) + 0x98) - lVar2) / 0x28) <= uVar10) {
        regex_error::regex_error
                  ((regex_error *)local_138,error_badmark,"invalid named back-reference");
        impl.px = (element_type *)anon_var_dwarf_66751;
        impl.pn.pi_ = (sp_counted_base *)anon_var_dwarf_6856e;
        throw_exception<boost::xpressive::regex_error>
                  ((regex_error *)local_138,(source_location *)&impl);
      }
      _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (lVar2 + lVar11),&name);
      if (_Var7) break;
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x28;
    }
    detail::
    make_backref_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (__return_storage_ptr__,
               (detail *)(ulong)*(uint *)(*(long *)(*(long *)(this + 0x230) + 0x90) + 0x20 + lVar11)
               ,*(int *)(this + 0x220),(syntax_option_type)this_00,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)tr);
    break;
  default:
    lVar11 = *(long *)this;
    *(long *)this = lVar11 + 1;
    uVar12 = (undefined4)(lVar11 + 1);
    impl.px = (element_type *)CONCAT44(impl.px._4_4_,uVar12);
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::mark_begin_matcher>
              ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,(detail *)&impl,matcher);
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_f0,
                (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
    impl.px = (element_type *)CONCAT44(impl.px._4_4_,uVar12);
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::mark_end_matcher>
              ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,(detail *)&impl,matcher_00);
LAB_0012293b:
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&seq_end,(sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_138);
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
LAB_00122958:
    bVar13 = false;
    bVar3 = false;
    no = false;
    bVar4 = false;
    goto LAB_00122962;
  }
  detail::
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~sequence(&seq_end);
  detail::
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~sequence(&local_f0);
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

detail::sequence<BidiIter> parse_group(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        int mark_nbr = 0;
        bool keeper = false;
        bool lookahead = false;
        bool lookbehind = false;
        bool negative = false;
        string_type name;

        detail::sequence<BidiIter> seq, seq_end;
        FwdIter tmp = FwdIter();

        syntax_option_type old_flags = this->traits_.flags();

        switch(this->traits_.get_group_type(begin, end, name))
        {
        case token_no_mark:
            // Don't process empty groups like (?:) or (?i)
            // BUGBUG this doesn't handle the degenerate (?:)+ correctly
            if(token_group_end == this->traits_.get_token(tmp = begin, end))
            {
                return this->parse_atom(begin = tmp, end);
            }
            break;

        case token_negative_lookahead:
            negative = true;
            BOOST_FALLTHROUGH;
        case token_positive_lookahead:
            lookahead = true;
            break;

        case token_negative_lookbehind:
            negative = true;
            BOOST_FALLTHROUGH;
        case token_positive_lookbehind:
            lookbehind = true;
            break;

        case token_independent_sub_expression:
            keeper = true;
            break;

        case token_comment:
            while(BOOST_XPR_ENSURE_(begin != end, error_paren, "mismatched parenthesis"))
            {
                switch(this->traits_.get_token(begin, end))
                {
                case token_group_end:
                    return this->parse_atom(begin, end);
                case token_escape:
                    BOOST_XPR_ENSURE_(begin != end, error_escape, "incomplete escape sequence");
                    BOOST_FALLTHROUGH;
                case token_literal:
                    ++begin;
                    break;
                default:
                    break;
                }
            }
            break;

        case token_recurse:
            BOOST_XPR_ENSURE_
            (
                begin != end && token_group_end == this->traits_.get_token(begin, end)
              , error_paren
              , "mismatched parenthesis"
            );
            return detail::make_dynamic<BidiIter>(detail::regex_byref_matcher<BidiIter>(this->self_));

        case token_rule_assign:
            BOOST_THROW_EXCEPTION(
                regex_error(error_badrule, "rule assignments must be at the front of the regex")
            );
            break;

        case token_rule_ref:
            {
                typedef detail::core_access<BidiIter> access;
                BOOST_XPR_ENSURE_
                (
                    begin != end && token_group_end == this->traits_.get_token(begin, end)
                  , error_paren
                  , "mismatched parenthesis"
                );
                basic_regex<BidiIter> &rex = this->rules_[name];
                shared_ptr<detail::regex_impl<BidiIter> > impl = access::get_regex_impl(rex);
                this->self_->track_reference(*impl);
                return detail::make_dynamic<BidiIter>(detail::regex_byref_matcher<BidiIter>(impl));
            }

        case token_named_mark:
            mark_nbr = static_cast<int>(++this->mark_count_);
            for(std::size_t i = 0; i < this->self_->named_marks_.size(); ++i)
            {
                BOOST_XPR_ENSURE_(this->self_->named_marks_[i].name_ != name, error_badmark, "named mark already exists");
            }
            this->self_->named_marks_.push_back(detail::named_mark<char_type>(name, this->mark_count_));
            seq = detail::make_dynamic<BidiIter>(detail::mark_begin_matcher(mark_nbr));
            seq_end = detail::make_dynamic<BidiIter>(detail::mark_end_matcher(mark_nbr));
            break;

        case token_named_mark_ref:
            BOOST_XPR_ENSURE_
            (
                begin != end && token_group_end == this->traits_.get_token(begin, end)
              , error_paren
              , "mismatched parenthesis"
            );
            for(std::size_t i = 0; i < this->self_->named_marks_.size(); ++i)
            {
                if(this->self_->named_marks_[i].name_ == name)
                {
                    mark_nbr = static_cast<int>(this->self_->named_marks_[i].mark_nbr_);
                    return detail::make_backref_xpression<BidiIter>
                    (
                        mark_nbr, this->traits_.flags(), this->rxtraits()
                    );
                }
            }
            BOOST_THROW_EXCEPTION(regex_error(error_badmark, "invalid named back-reference"));
            break;

        default:
            mark_nbr = static_cast<int>(++this->mark_count_);
            seq = detail::make_dynamic<BidiIter>(detail::mark_begin_matcher(mark_nbr));
            seq_end = detail::make_dynamic<BidiIter>(detail::mark_end_matcher(mark_nbr));
            break;
        }

        // alternates
        seq += this->parse_alternates(begin, end);
        seq += seq_end;
        BOOST_XPR_ENSURE_
        (
            begin != end && token_group_end == this->traits_.get_token(begin, end)
          , error_paren
          , "mismatched parenthesis"
        );

        typedef detail::shared_matchable<BidiIter> xpr_type;
        if(lookahead)
        {
            seq += detail::make_independent_end_xpression<BidiIter>(seq.pure());
            detail::lookahead_matcher<xpr_type> lam(seq.xpr(), negative, seq.pure());
            seq = detail::make_dynamic<BidiIter>(lam);
        }
        else if(lookbehind)
        {
            seq += detail::make_independent_end_xpression<BidiIter>(seq.pure());
            detail::lookbehind_matcher<xpr_type> lbm(seq.xpr(), seq.width().value(), negative, seq.pure());
            seq = detail::make_dynamic<BidiIter>(lbm);
        }
        else if(keeper) // independent sub-expression
        {
            seq += detail::make_independent_end_xpression<BidiIter>(seq.pure());
            detail::keeper_matcher<xpr_type> km(seq.xpr(), seq.pure());
            seq = detail::make_dynamic<BidiIter>(km);
        }

        // restore the modifiers
        this->traits_.flags(old_flags);
        return seq;
    }